

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<CPP::WriteInitialization::Item_*>::relocate
          (QArrayDataPointer<CPP::WriteInitialization::Item_*> *this,qsizetype offset,Item ***data)

{
  Item **d_first;
  Item **ppIVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<CPP::WriteInitialization::Item*,long_long>
            (this->ptr,this->size,d_first);
  if (data != (Item ***)0x0) {
    ppIVar1 = *data;
    if ((this->ptr <= ppIVar1) && (ppIVar1 < this->ptr + this->size)) {
      *data = ppIVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }